

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QCommandLineOptionPrivate>::detach_helper
          (QSharedDataPointer<QCommandLineOptionPrivate> *this)

{
  QCommandLineOptionPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QCommandLineOptionPrivate *pQVar4;
  
  pQVar4 = (QCommandLineOptionPrivate *)operator_new(0x70);
  pQVar1 = (this->d).ptr;
  (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar2 = (pQVar1->names).d.d;
  (pQVar4->names).d.d = pDVar2;
  (pQVar4->names).d.ptr = (pQVar1->names).d.ptr;
  (pQVar4->names).d.size = (pQVar1->names).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar3 = (pQVar1->valueName).d.d;
  (pQVar4->valueName).d.d = pDVar3;
  (pQVar4->valueName).d.ptr = (pQVar1->valueName).d.ptr;
  (pQVar4->valueName).d.size = (pQVar1->valueName).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar3 = (pQVar1->description).d.d;
  (pQVar4->description).d.d = pDVar3;
  (pQVar4->description).d.ptr = (pQVar1->description).d.ptr;
  (pQVar4->description).d.size = (pQVar1->description).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar2 = (pQVar1->defaultValues).d.d;
  (pQVar4->defaultValues).d.d = pDVar2;
  (pQVar4->defaultValues).d.ptr = (pQVar1->defaultValues).d.ptr;
  (pQVar4->defaultValues).d.size = (pQVar1->defaultValues).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  (pQVar4->flags).super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
  super_QFlagsStorage<QCommandLineOption::Flag>.i =
       (pQVar1->flags).super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
       super_QFlagsStorage<QCommandLineOption::Flag>.i;
  LOCK();
  (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type_conflict)
       (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QCommandLineOptionPrivate *)0x0)) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&(pQVar1->defaultValues).d);
    pDVar3 = (pQVar1->description).d.d;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           -1);
      UNLOCK();
      if ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> ==
          0) {
        QArrayData::deallocate(&((pQVar1->description).d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar3 = (pQVar1->valueName).d.d;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           -1);
      UNLOCK();
      if ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> ==
          0) {
        QArrayData::deallocate(&((pQVar1->valueName).d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&(pQVar1->names).d);
    operator_delete(pQVar1,0x70);
  }
  (this->d).ptr = pQVar4;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}